

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix-fds.c
# Opt level: O1

void delete_from_fd(lws_context *context,int fd)

{
  lws **pplVar1;
  lws **pplVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  
  pplVar1 = context->lws_lookup;
  if ((context->field_0x7b8 & 4) == 0) {
    if (pplVar1 != (lws **)0x0) {
      pplVar1[fd] = (lws *)0x0;
    }
  }
  else {
    if (pplVar1 == (lws **)0x0) {
      __assert_fail("p",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/woodsts[P]libwebsockets/lib/plat/unix/unix-fds.c"
                    ,0xba,"void delete_from_fd(const struct lws_context *, int)");
    }
    uVar3 = (ulong)context->max_fds;
    if (uVar3 != 0) {
      lVar4 = 0;
      do {
        if ((*(long *)((long)pplVar1 + lVar4) != 0) &&
           (*(int *)(*(long *)((long)pplVar1 + lVar4) + 0x450) == fd)) {
          *(undefined8 *)((long)pplVar1 + lVar4) = 0;
          break;
        }
        lVar4 = lVar4 + 8;
      } while (uVar3 << 3 != lVar4);
    }
    pplVar2 = context->lws_lookup;
    if (pplVar2 != pplVar1 + uVar3) {
      uVar5 = 0;
      do {
        if ((*pplVar2 != (lws *)0x0) && (((*pplVar2)->desc).sockfd == fd)) {
          _lws_log(1,"%s: fd %d in lws_lookup again at %d\n","delete_from_fd",fd,uVar5);
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/woodsts[P]libwebsockets/lib/plat/unix/unix-fds.c"
                        ,0xce,"void delete_from_fd(const struct lws_context *, int)");
        }
        pplVar2 = pplVar2 + 1;
        uVar5 = (ulong)((int)uVar5 + 1);
      } while (pplVar2 != pplVar1 + uVar3);
    }
  }
  return;
}

Assistant:

void
delete_from_fd(const struct lws_context *context, int fd)
{

	struct lws **p, **done;

	if (!context->max_fds_unrelated_to_ulimit) {
		if (context->lws_lookup)
			context->lws_lookup[fd - lws_plat_socket_offset()] = NULL;

		return;
	}

	/* slow fds handling */

	p = context->lws_lookup;
	assert(p);

	done = &p[context->max_fds];

	/* find the match */

	while (p != done && (!*p || (*p)->desc.sockfd != fd))
		p++;

	if (p != done)
		*p = NULL;

#if defined(_DEBUG)
	p = context->lws_lookup;
	while (p != done && (!*p || (*p)->desc.sockfd != fd))
		p++;

	if (p != done) {
		lwsl_err("%s: fd %d in lws_lookup again at %d\n", __func__,
				fd, (int)(p - context->lws_lookup));
		assert(0);
	}
#endif
}